

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

void __thiscall mkvparser::CuePoint::CuePoint(CuePoint *this,long idx,longlong pos)

{
  this->m_element_start = 0;
  this->m_element_size = 0;
  this->m_index = idx;
  this->m_timecode = -pos;
  this->m_track_positions = (TrackPosition *)0x0;
  this->m_track_positions_count = 0;
  if (0 < pos) {
    return;
  }
  __assert_fail("pos > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                ,0x8db,"mkvparser::CuePoint::CuePoint(long, long long)");
}

Assistant:

CuePoint::CuePoint(long idx, long long pos)
    : m_element_start(0),
      m_element_size(0),
      m_index(idx),
      m_timecode(-1 * pos),
      m_track_positions(NULL),
      m_track_positions_count(0) {
  assert(pos > 0);
}